

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r,REF_DBL t)

{
  REF_DBL *m1;
  int node;
  int node_00;
  REF_NODE ref_node;
  REF_NODE pRVar1;
  double __y;
  uint uVar2;
  REF_STATUS RVar3;
  void *__ptr;
  ulong uVar4;
  REF_DBL *pRVar5;
  undefined8 uVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  REF_EDGE ref_edge;
  REF_DBL diag_system [12];
  REF_DBL limited [6];
  REF_DBL limit_metric [6];
  
  ref_node = ref_grid->node;
  dVar13 = log((double)(~-(ulong)(r < 1.0) & (ulong)r | -(ulong)(r < 1.0) & 0x3ff8000000000000));
  uVar2 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar2 == 0) {
    pRVar1 = ref_grid->node;
    uVar2 = pRVar1->max;
    if ((int)uVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL negative");
      return 1;
    }
    __ptr = malloc((ulong)uVar2 * 0x30);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x341,"ref_metric_mixed_space_gradation","malloc metric_orig of REF_DBL NULL");
      return 2;
    }
    __y = (double)(-(ulong)(t < 0.0) & 0x3fc0000000000000 |
                  ~-(ulong)(t < 0.0) &
                  (~-(ulong)(t < 1.0) & (ulong)t | -(ulong)(t < 1.0) & 0x3fc0000000000000));
    pRVar5 = metric;
    pvVar7 = __ptr;
    for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
      if (-1 < pRVar1->global[uVar4]) {
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          *(REF_DBL *)((long)pvVar7 + lVar8 * 8) = pRVar5[lVar8];
        }
      }
      pvVar7 = (void *)((long)pvVar7 + 0x30);
      pRVar5 = pRVar5 + 6;
    }
    for (lVar8 = 0; lVar8 < ref_edge->n; lVar8 = lVar8 + 1) {
      node = ref_edge->e2n[lVar8 * 2];
      lVar12 = (long)node;
      node_00 = ref_edge->e2n[lVar8 * 2 + 1];
      lVar9 = (long)node_00;
      pRVar5 = ref_node->real;
      dVar20 = pRVar5[lVar9 * 0xf] - pRVar5[lVar12 * 0xf];
      dVar19 = pRVar5[lVar9 * 0xf + 1] - pRVar5[lVar12 * 0xf + 1];
      dVar18 = pRVar5[lVar9 * 0xf + 2] - pRVar5[lVar12 * 0xf + 2];
      dVar14 = *(double *)((long)__ptr + lVar9 * 0x30 + 8);
      dVar15 = *(double *)((long)__ptr + lVar9 * 0x30 + 0x10);
      dVar16 = *(double *)((long)__ptr + lVar9 * 0x30 + 0x20);
      dVar14 = (*(double *)((long)__ptr + lVar9 * 0x30 + 0x28) * dVar18 +
               dVar15 * dVar20 + dVar16 * dVar19) * dVar18 +
               (dVar15 * dVar18 + *(double *)((long)__ptr + lVar9 * 0x30) * dVar20 + dVar19 * dVar14
               ) * dVar20 +
               (dVar16 * dVar18 +
               dVar14 * dVar20 + *(double *)((long)__ptr + lVar9 * 0x30 + 0x18) * dVar19) * dVar19;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      pRVar5 = (REF_DBL *)((long)__ptr + lVar9 * 0x30);
      uVar2 = ref_matrix_diag_m(pRVar5,diag_system);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x358,"ref_metric_mixed_space_gradation",(ulong)uVar2,"decomp");
LAB_001ac080:
        ref_metric_show(pRVar5);
        return uVar2;
      }
      dVar15 = SQRT(dVar18 * dVar18 + dVar20 * dVar20 + dVar19 * dVar19);
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        dVar16 = diag_system[lVar11];
        if (dVar16 < 0.0) {
          dVar16 = sqrt(dVar16);
        }
        else {
          dVar16 = SQRT(dVar16);
        }
        dVar16 = pow(dVar16 * dVar15 * dVar13 + 1.0,__y);
        dVar17 = pow(dVar13 * dVar14 + 1.0,1.0 - __y);
        dVar16 = pow(dVar17 * dVar16,-2.0);
        diag_system[lVar11] = dVar16 * diag_system[lVar11];
      }
      uVar2 = ref_matrix_form_m(diag_system,limit_metric);
      if (uVar2 != 0) {
        uVar4 = (ulong)uVar2;
        pcVar10 = "reform limit";
        uVar6 = 0x35f;
        goto LAB_001ab984;
      }
      m1 = (REF_DBL *)((long)__ptr + lVar12 * 0x30);
      RVar3 = ref_matrix_intersect(m1,limit_metric,limited);
      if (RVar3 == 0) {
        uVar2 = ref_matrix_intersect(metric + lVar12 * 6,limited,metric + lVar12 * 6);
        if (uVar2 != 0) {
          uVar4 = (ulong)uVar2;
          pcVar10 = "update m0";
          uVar6 = 0x365;
          goto LAB_001ab984;
        }
      }
      else {
        ref_node_location(ref_node,node);
        printf("dist %24.15e ratio %24.15e\n",dVar15,dVar14);
        puts("RECOVER ref_metric_mixed_space_gradation");
      }
      dVar14 = (m1[5] * dVar18 + m1[2] * dVar20 + dVar19 * m1[4]) * dVar18 +
               (m1[2] * dVar18 + *m1 * dVar20 + dVar19 * m1[1]) * dVar20 +
               (m1[4] * dVar18 + m1[1] * dVar20 + m1[3] * dVar19) * dVar19;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      uVar2 = ref_matrix_diag_m(m1,diag_system);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x36f,"ref_metric_mixed_space_gradation",(ulong)uVar2,"decomp");
        pRVar5 = m1;
        goto LAB_001ac080;
      }
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        dVar16 = diag_system[lVar12];
        if (dVar16 < 0.0) {
          dVar16 = sqrt(dVar16);
        }
        else {
          dVar16 = SQRT(dVar16);
        }
        dVar16 = pow(dVar16 * dVar15 * dVar13 + 1.0,__y);
        dVar18 = pow(dVar13 * dVar14 + 1.0,1.0 - __y);
        dVar16 = pow(dVar18 * dVar16,-2.0);
        diag_system[lVar12] = dVar16 * diag_system[lVar12];
      }
      uVar2 = ref_matrix_form_m(diag_system,limit_metric);
      if (uVar2 != 0) {
        uVar4 = (ulong)uVar2;
        pcVar10 = "reform limit";
        uVar6 = 0x376;
        goto LAB_001ab984;
      }
      RVar3 = ref_matrix_intersect(pRVar5,limit_metric,limited);
      if (RVar3 == 0) {
        uVar2 = ref_matrix_intersect(metric + lVar9 * 6,limited,metric + lVar9 * 6);
        if (uVar2 != 0) {
          uVar4 = (ulong)uVar2;
          pcVar10 = "update m1";
          uVar6 = 0x37c;
          goto LAB_001ab984;
        }
      }
      else {
        ref_node_location(ref_node,node_00);
        printf("dist %24.15e ratio %24.15e\n",dVar15,dVar14);
        puts("RECOVER ref_metric_mixed_space_gradation");
      }
    }
    free(__ptr);
    ref_edge_free(ref_edge);
    uVar2 = ref_node_ghost_dbl(ref_grid->node,metric,6);
    if (uVar2 == 0) {
      return 0;
    }
    uVar4 = (ulong)uVar2;
    pcVar10 = "update ghosts";
    uVar6 = 0x388;
  }
  else {
    uVar4 = (ulong)uVar2;
    pcVar10 = "orig edges";
    uVar6 = 0x33f;
  }
LAB_001ab984:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar6,
         "ref_metric_mixed_space_gradation",uVar4,pcVar10);
  return (REF_STATUS)uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_mixed_space_gradation(REF_DBL *metric,
                                                    REF_GRID ref_grid,
                                                    REF_DBL r, REF_DBL t) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL dist, ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;
  REF_DBL diag_system[12];
  REF_DBL metric_space, phys_space;

  if (r < 1.0) r = 1.5;
  if (t < 0.0 || 1.0 > t) t = 1.0 / 8.0;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028
   * 6.2.1. Mixed-space homogeneous gradation */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
    dist = sqrt(ref_math_dot(direction, direction));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node1]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node1])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node0]), limited,
                               &(metric[6 * node0])),
          "update m0");
    } else {
      ref_node_location(ref_node, node0);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);

    RSB(ref_matrix_diag_m(&(metric_orig[6 * node0]), diag_system), "decomp",
        { ref_metric_show(&(metric_orig[6 * node0])); });
    for (i = 0; i < 3; i++) {
      metric_space = 1.0 + log_r * ratio;
      phys_space = 1.0 + sqrt(ref_matrix_eig(diag_system, i)) * dist * log_r;
      enlarge = pow(pow(phys_space, t) * pow(metric_space, 1.0 - t), -2.0);
      ref_matrix_eig(diag_system, i) *= enlarge;
    }
    RSS(ref_matrix_form_m(diag_system, limit_metric), "reform limit");

    if (REF_SUCCESS == ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      RSS(ref_matrix_intersect(&(metric[6 * node1]), limited,
                               &(metric[6 * node1])),
          "update m1");
    } else {
      ref_node_location(ref_node, node1);
      printf("dist %24.15e ratio %24.15e\n", dist, ratio);
      printf("RECOVER ref_metric_mixed_space_gradation\n");
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}